

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O2

void __thiscall hrgls::API::~API(API *this)

{
  ostream *poVar1;
  API_private *pAVar2;
  
  pAVar2 = this->m_private;
  if (pAVar2 != (API_private *)0x0) {
    if (200 < pAVar2->verbosity) {
      poVar1 = std::operator<<((ostream *)&std::cout,"API::~API(): Destroying API:");
      std::endl<char,std::char_traits<char>>(poVar1);
      pAVar2 = this->m_private;
    }
    pAVar2->quitThread = true;
    std::thread::join();
    pAVar2 = this->m_private;
    if (pAVar2 != (API_private *)0x0) {
      API_private::~API_private(pAVar2);
      goto LAB_00106bcc;
    }
  }
  pAVar2 = (API_private *)0x0;
LAB_00106bcc:
  operator_delete(pAVar2);
  return;
}

Assistant:

API::~API()
  {
    // Stop my thread.
    if (m_private) {
        if (m_private->verbosity > 200) {
          std::cout << "API::~API(): Destroying API:" << std::endl;
        }
        m_private->quitThread = true;
        m_private->myThread.join();
    }

    delete m_private;
  }